

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O3

OperationReturn __thiscall
FormatTypeRAW::GetFileListFromName
          (FormatTypeRAW *this,char *file_path,
          vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  pointer pbVar6;
  pointer pbVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list_1;
  string file_formatted;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directory_list;
  int side;
  int track;
  string filename;
  string dir_path;
  string last_part;
  string full_path;
  char *in_stack_fffffffffffffe88;
  undefined1 local_168 [16];
  undefined1 local_158 [32];
  long *local_138;
  long local_130;
  long local_128;
  undefined8 uStack_120;
  pointer *local_118;
  long local_110;
  pointer local_108 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *local_e0;
  undefined1 local_d8 [4];
  undefined1 local_d4 [4];
  string local_d0;
  long *local_b0;
  ulong local_a8;
  long local_a0 [2];
  long *local_90;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_e0 = file_list;
  bVar2 = IsDirectory(in_stack_fffffffffffffe88);
  if (bVar2) {
    local_168._0_8_ = (pointer)0x0;
    local_168._8_8_ = (pointer)0x0;
    local_158._0_8_ = (pointer)0x0;
    GetDirectoryContent(file_path,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168);
    return OK;
  }
  GetFullPath_abi_cxx11_((char *)0x14708e);
  GetFileFromPath_abi_cxx11_((char *)0x14709e);
  if (local_a8 < 9) {
    bVar2 = false;
    goto LAB_00147398;
  }
  std::__cxx11::string::substr((ulong)local_70,(ulong)&local_b0);
  iVar4 = __isoc99_sscanf(local_70[0],"%i.%i.",local_d4,local_d8);
  bVar2 = iVar4 == 2;
  if (bVar2) {
    GetDirectoryFromPath_abi_cxx11_((char *)0x147110);
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetDirectoryContent((char *)local_90,&local_f8);
    std::__cxx11::string::substr((ulong)local_168,(ulong)local_50);
    local_118 = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"*.*.raw","");
    pbVar7 = (pointer)((long)&((_Alloc_hider *)local_168._8_8_)->_M_p + local_110);
    pbVar6 = (pointer)0xf;
    if ((pointer)local_168._0_8_ != (pointer)local_158) {
      pbVar6 = (pointer)local_158._0_8_;
    }
    if (pbVar6 < pbVar7) {
      pbVar6 = (pointer)0xf;
      if (local_118 != local_108) {
        pbVar6 = local_108[0];
      }
      if (pbVar6 < pbVar7) goto LAB_001471b3;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,local_168._0_8_);
    }
    else {
LAB_001471b3:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append(local_168,(ulong)local_118);
    }
    local_138 = &local_128;
    plVar1 = puVar5 + 2;
    if ((long *)*puVar5 == plVar1) {
      local_128 = *plVar1;
      uStack_120 = puVar5[3];
    }
    else {
      local_128 = *plVar1;
      local_138 = (long *)*puVar5;
    }
    local_130 = puVar5[1];
    *puVar5 = plVar1;
    puVar5[1] = 0;
    *(undefined1 *)plVar1 = 0;
    if (local_118 != local_108) {
      operator_delete(local_118,(ulong)((long)&(local_108[0]->_M_dataplus)._M_p + 1));
    }
    if ((pointer)local_168._0_8_ != (pointer)local_158) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
    }
    if (local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_138,(undefined1 *)(local_130 + (long)local_138));
        bVar3 = MatchTextWithWildcards(pbVar7,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          local_158._8_8_ = 0;
          local_158[0x10] = '\0';
          local_168._0_8_ = (pointer)0x0;
          local_168._8_8_ = (pointer)0x0;
          local_158._0_8_ = (pointer)(local_158 + 0x10);
          std::__cxx11::string::_M_assign((string *)local_158);
          std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::push_back
                    (local_e0,(value_type *)local_168);
          if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
            operator_delete((void *)local_158._0_8_,CONCAT71(local_158._17_7_,local_158[0x10]) + 1);
          }
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != local_f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_138 != &local_128) {
      operator_delete(local_138,local_128 + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
LAB_00147398:
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (bVar2) {
    return OK;
  }
  return FILE_ERROR;
}

Assistant:

FormatTypeRAW::OperationReturn FormatTypeRAW::GetFileListFromName(const char* file_path,
                                                                  std::vector<TrackItem>& file_list)
{
#ifdef __MORPHOS__
   // Todo
   return -1;
#else

#endif

   // If file_path is a directory
   if (IsDirectory(file_path))
   {
      // walk the directory, 
      std::vector<std::string> file_list;
      GetDirectoryContent(file_path, file_list);

      // try to find pattern to get side / track
      // todo
      // fill the vector
   }
   else
   {
      // Otherwise, its a file : build a g�n�ric mask from this file
      std::string full_path = GetFullPath(file_path);
      std::string filename = GetFileFromPath(file_path);

      // Search for side / tracks. Filename should be of the form xxxx[track].[side].raw. Track si 00-41, side 0-1
      // Check last 8 characters
      if (filename.size() > 8)
      {
         std::string last_part = filename.substr(filename.size() - 8, 8);
         int track, side;
         if (sscanf(last_part.c_str(), "%i.%i.", &track, &side) != 2)
         {
            // Pattern not found
            return FILE_ERROR;
         }

         std::string dir_path = GetDirectoryFromPath(file_path);

         std::vector<std::string> directory_list;
         GetDirectoryContent(dir_path.c_str(), directory_list);

         std::string file_formatted = full_path.substr(0, full_path.size() - 8) + std::string("*.*.raw");

         for (auto it = directory_list.begin(); it != directory_list.end(); it++)
         {
            if (MatchTextWithWildcards(*it, file_formatted))
            {
               TrackItem item;
               item.buffer = nullptr;
               item.size = 0;
               item.path = *it;

               file_list.push_back(item);
            }
         }
      }
      else
      {
         // Not a regular RAW.... Will be hard to load !
         return FILE_ERROR;
      }


      // fill the vector
   }
   return OK;
}